

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O2

spv_result_t spvtools::val::InstructionPass(ValidationState_t *_,Instruction *inst)

{
  spv_parsed_operand_t *operand;
  uint16_t uVar1;
  pointer psVar2;
  pointer puVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  uint32_t uVar7;
  Capability cap;
  StorageClass SVar8;
  AddressingModel am;
  MemoryModel mm;
  spv_result_t sVar9;
  DiagnosticStream *pDVar10;
  Instruction *pIVar11;
  spv_parsed_instruction_t *in_RDX;
  Extension *extension_00;
  ExtensionSet *extensions;
  ExtensionSet *extensions_00;
  char *pcVar12;
  ulong uVar13;
  uint32_t mask_bit;
  Op OVar14;
  uint uVar15;
  string extension_str;
  spv_opcode_desc inst_desc_1;
  Extension extension;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 10:
    GetExtensionString_abi_cxx11_(&extension_str,(spvtools *)&inst->inst_,in_RDX);
    bVar4 = GetExtensionFromString
                      ((spvtools *)extension_str._M_dataplus._M_p,(char *)&extension,extension_00);
    if (!bVar4) {
      ValidationState_t::diag(&local_208,_,SPV_WARNING,inst);
      std::operator<<((ostream *)&local_208,"Found unrecognized extension ");
      std::operator<<((ostream *)&local_208,(string *)&extension_str);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
    std::__cxx11::string::_M_dispose();
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xf:
    break;
  case 0xe:
    if ((_->addressing_model_ != Max) && (_->memory_model_ != Max)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar12 = "OpMemoryModel should only be provided once.";
      goto LAB_001ccadb;
    }
    am = Instruction::GetOperandAs<spv::AddressingModel>(inst,0);
    ValidationState_t::set_addressing_model(_,am);
    mm = Instruction::GetOperandAs<spv::MemoryModel>(inst,1);
    ValidationState_t::set_memory_model(_,mm);
    break;
  case 0x10:
switchD_001cc885_caseD_10:
    puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ValidationState_t::RegisterExecutionModeForEntryPoint(_,puVar3[1],puVar3[2]);
    break;
  case 0x11:
    cap = Instruction::GetOperandAs<spv::Capability>(inst,0);
    ValidationState_t::RegisterCapability(_,cap);
    break;
  default:
    if (uVar1 == 0x3b) {
      SVar8 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
      uVar7 = (inst->inst_).result_id;
      if (SVar8 == Function) {
        ValidationState_t::registerLocalVariable(_,uVar7);
        if ((ulong)(_->options_->universal_limits_).max_local_variables <
            (_->local_vars_)._M_h._M_element_count) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
          pcVar12 = 
          "Number of local variables (\'Function\' Storage Class) exceeded the valid limit (";
LAB_001cca81:
          std::operator<<((ostream *)&local_208,pcVar12);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          std::operator<<((ostream *)&local_208,").");
          sVar9 = local_208.error_;
          DiagnosticStream::~DiagnosticStream(&local_208);
          if (sVar9 != SPV_SUCCESS) {
            return sVar9;
          }
        }
      }
      else {
        ValidationState_t::registerGlobalVariable(_,uVar7);
        if ((ulong)(_->options_->universal_limits_).max_global_variables <
            (_->global_vars_)._M_h._M_element_count) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
          pcVar12 = 
          "Number of Global Variables (Storage Class other than \'Function\') exceeded the valid limit ("
          ;
          goto LAB_001cca81;
        }
      }
    }
    else {
      if (uVar1 == 0x14b) goto switchD_001cc885_caseD_10;
      if (uVar1 == 0x1515) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,BindlessTextureNV);
        if (!bVar4) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_MISSING_EXTENSION,inst);
          pcVar12 = 
          "OpSamplerImageAddressingModeNV supported only with extension SPV_NV_bindless_texture";
LAB_001ccadb:
          std::operator<<((ostream *)&local_208,pcVar12);
          DiagnosticStream::~DiagnosticStream(&local_208);
          return local_208.error_;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        uVar7 = ValidationState_t::samplerimage_variable_address_mode(_);
        if (uVar7 != 0) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
          pcVar12 = "OpSamplerImageAddressingModeNV should only be provided once";
          goto LAB_001ccadb;
        }
        if ((uVar6 != 0x20) && (uVar6 != 0x40)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
          goto LAB_001ccadb;
        }
        ValidationState_t::set_samplerimage_variable_address_mode(_,uVar6);
      }
    }
  }
  uVar5 = (inst->inst_).opcode;
  OVar14 = (Op)uVar5;
  if (uVar5 - 0x135 < 4) {
    AssemblyGrammar::lookupOpcode(&_->grammar_,OVar14,(spv_opcode_desc *)&extension_str);
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::operator<<((ostream *)&local_208,"Invalid Opcode name \'Op");
    pDVar10 = DiagnosticStream::operator<<(&local_208,(char **)extension_str._M_dataplus._M_p);
    std::operator<<((ostream *)pDVar10,"\'");
    sVar9 = pDVar10->error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    OVar14 = (Op)(inst->inst_).opcode;
  }
  if (((OVar14 & ~OpString) == OpGroupIAddNonUniformAMD) &&
     (bVar4 = EnumSet<spvtools::Extension>::contains(&_->module_extensions_,kSPV_AMD_shader_ballot),
     bVar4)) {
LAB_001ccbd7:
    EnumSet<spv::Capability>::EnumSet((EnumSet<spv::Capability> *)&extension_str);
  }
  else {
    local_208._0_8_ = 0;
    sVar9 = AssemblyGrammar::lookupOpcode(&_->grammar_,OVar14,(spv_opcode_desc *)&local_208);
    if (sVar9 != SPV_SUCCESS) goto LAB_001ccbd7;
    AssemblyGrammar::filterCapsAgainstTargetEnv
              ((CapabilitySet *)&extension_str,&_->grammar_,*(Capability **)(local_208._0_8_ + 0x10)
               ,*(uint32_t *)(local_208._0_8_ + 0xc));
  }
  bVar4 = ValidationState_t::HasAnyOfCapabilities(_,(CapabilitySet *)&extension_str);
  if (bVar4) {
    uVar13 = 0;
    do {
      while( true ) {
        psVar2 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar13)
        {
          sVar9 = SPV_SUCCESS;
          goto LAB_001ccd35;
        }
        operand = psVar2 + uVar13;
        uVar6 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[psVar2[uVar13].offset];
        bVar4 = spvOperandIsConcreteMask(psVar2[uVar13].type);
        if (!bVar4) break;
        uVar13 = uVar13 + 1;
        for (uVar15 = 0x80000000; uVar15 != 0; uVar15 = uVar15 >> 1) {
          if (((uVar15 & uVar6) != 0) &&
             (sVar9 = anon_unknown_1::CheckRequiredCapabilities(_,inst,uVar13,operand,uVar15),
             sVar9 != SPV_SUCCESS)) goto LAB_001ccd35;
        }
      }
      bVar4 = spvIsIdType(operand->type);
      uVar13 = uVar13 + 1;
    } while ((bVar4) ||
            (sVar9 = anon_unknown_1::CheckRequiredCapabilities(_,inst,uVar13,operand,uVar6),
            sVar9 == SPV_SUCCESS));
  }
  else {
    pIVar11 = inst;
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
    std::operator<<((ostream *)&local_208,"Opcode ");
    pcVar12 = spvOpcodeString(OVar14);
    std::operator<<((ostream *)&local_208,pcVar12);
    std::operator<<((ostream *)&local_208," requires one of these capabilities: ");
    (anonymous_namespace)::ToString_abi_cxx11_
              ((string *)&extension,(_anonymous_namespace_ *)&extension_str,
               (CapabilitySet *)&_->grammar_,(AssemblyGrammar *)pIVar11);
    std::operator<<((ostream *)&local_208,(string *)&extension);
    sVar9 = local_208.error_;
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
LAB_001ccd35:
  std::
  _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   *)&extension_str);
  if (sVar9 != SPV_SUCCESS) {
    return sVar9;
  }
  uVar6 = (inst->inst_).result_id;
  uVar7 = ValidationState_t::getIdBound(_);
  if (uVar7 <= uVar6) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::operator<<((ostream *)&local_208,"Result <id> \'");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,"\' must be less than the ID bound \'");
    ValidationState_t::getIdBound(_);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,"\'.");
    sVar9 = local_208.error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
  }
  uVar5 = (inst->inst_).opcode;
  if (uVar5 == 0x1e) {
    uVar5 = (ushort)(_->options_->universal_limits_).max_struct_members;
    if ((ulong)uVar5 <
        ((long)(inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
      std::operator<<((ostream *)&local_208,"Number of OpTypeStruct members (");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,") has exceeded the limit (");
      std::ostream::operator<<(&local_208,uVar5);
      pcVar12 = ").";
LAB_001ccf16:
      std::operator<<((ostream *)&local_208,pcVar12);
      sVar9 = local_208.error_;
      DiagnosticStream::~DiagnosticStream(&local_208);
      if (sVar9 != SPV_SUCCESS) {
        return sVar9;
      }
    }
    else {
      uVar6 = 0;
      for (uVar13 = 2;
          puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar13 < (ulong)((long)(inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
          uVar13 = uVar13 + 1) {
        pIVar11 = ValidationState_t::FindDef(_,puVar3[uVar13]);
        if (((pIVar11 != (Instruction *)0x0) && ((pIVar11->inst_).opcode == 0x1e)) &&
           (uVar7 = ValidationState_t::struct_nesting_depth(_,(pIVar11->inst_).result_id),
           uVar6 <= uVar7)) {
          uVar6 = uVar7;
        }
      }
      uVar15 = (_->options_->universal_limits_).max_struct_depth;
      ValidationState_t::set_struct_nesting_depth(_,(inst->inst_).result_id,uVar6 + 1);
      if (uVar15 < uVar6 + 1) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
        std::operator<<((ostream *)&local_208,"Structure Nesting Depth may not be larger than ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::operator<<((ostream *)&local_208,". Found ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar12 = ".";
        goto LAB_001ccf16;
      }
    }
    uVar5 = (inst->inst_).opcode;
  }
  if ((uVar5 == 0xfb) &&
     (uVar5 = 0xfb,
     (ulong)(_->options_->universal_limits_).max_switch_branches <
     ((long)(inst->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(inst->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start >> 4) - 2U >> 1)) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::operator<<((ostream *)&local_208,"Number of (literal, label) pairs in OpSwitch (");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,") exceeds the limit (");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,").");
    sVar9 = local_208.error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar5 = (inst->inst_).opcode;
  }
  sVar9 = AssemblyGrammar::lookupOpcode(&_->grammar_,(uint)uVar5,&inst_desc_1);
  if (sVar9 != SPV_SUCCESS) {
    __assert_fail("r == SPV_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_instruction.cpp"
                  ,0x119,
                  "spv_result_t spvtools::val::(anonymous namespace)::VersionCheck(ValidationState_t &, const Instruction *)"
                 );
  }
  uVar6 = _->version_;
  OVar14 = (Op)uVar5;
  if (inst_desc_1->lastVersion < uVar6) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
    pcVar12 = spvOpcodeString(OVar14);
    std::operator<<((ostream *)&local_208,pcVar12);
    std::operator<<((ostream *)&local_208," requires SPIR-V version ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,".");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208," or earlier");
    DiagnosticStream::~DiagnosticStream(&local_208);
    return local_208.error_;
  }
  uVar15 = inst_desc_1->minVersion;
  if (((inst->inst_).opcode != 0x1140) && (inst_desc_1->numCapabilities != 0)) {
    return SPV_SUCCESS;
  }
  EnumSet<spvtools::Extension>::EnumSet
            ((EnumSet<spvtools::Extension> *)&extension_str,inst_desc_1->numExtensions,
             inst_desc_1->extensions);
  if (extension_str.field_2._8_8_ == 0) {
    if (uVar15 == 0xffffffff) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      pcVar12 = spvOpcodeString((uint)uVar5);
      std::operator<<((ostream *)&local_208,pcVar12);
      std::operator<<((ostream *)&local_208," is reserved for future use.");
      sVar9 = local_208.error_;
    }
    else {
      sVar9 = SPV_SUCCESS;
      if (uVar15 <= uVar6) goto LAB_001cd324;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      pcVar12 = spvOpcodeString(OVar14);
      std::operator<<((ostream *)&local_208,pcVar12);
      std::operator<<((ostream *)&local_208," requires SPIR-V version ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,".");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208," at minimum.");
      sVar9 = local_208.error_;
    }
  }
  else {
    bVar4 = ValidationState_t::HasAnyOfExtensions(_,(ExtensionSet *)&extension_str);
    sVar9 = SPV_SUCCESS;
    if (bVar4) goto LAB_001cd324;
    if (uVar15 == 0xffffffff) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_MISSING_EXTENSION,inst);
      pcVar12 = spvOpcodeString(OVar14);
      std::operator<<((ostream *)&local_208,pcVar12);
      std::operator<<((ostream *)&local_208," requires one of the following extensions: ");
      ExtensionSetToString_abi_cxx11_((string *)&extension,(spvtools *)&extension_str,extensions_00)
      ;
      std::operator<<((ostream *)&local_208,(string *)&extension);
      std::__cxx11::string::_M_dispose();
      sVar9 = local_208.error_;
    }
    else {
      if (uVar15 <= uVar6) goto LAB_001cd324;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      pcVar12 = spvOpcodeString(OVar14);
      std::operator<<((ostream *)&local_208,pcVar12);
      std::operator<<((ostream *)&local_208," requires SPIR-V version ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,".");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208," at minimum or one of the following extensions: ");
      ExtensionSetToString_abi_cxx11_((string *)&extension,(spvtools *)&extension_str,extensions);
      std::operator<<((ostream *)&local_208,(string *)&extension);
      std::__cxx11::string::_M_dispose();
      sVar9 = local_208.error_;
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001cd324:
  std::
  _Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                   *)&extension_str);
  return sVar9;
}

Assistant:

spv_result_t InstructionPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (opcode == spv::Op::OpExtension) {
    CheckIfKnownExtension(_, inst);
  } else if (opcode == spv::Op::OpCapability) {
    _.RegisterCapability(inst->GetOperandAs<spv::Capability>(0));
  } else if (opcode == spv::Op::OpMemoryModel) {
    if (_.has_memory_model_specified()) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpMemoryModel should only be provided once.";
    }
    _.set_addressing_model(inst->GetOperandAs<spv::AddressingModel>(0));
    _.set_memory_model(inst->GetOperandAs<spv::MemoryModel>(1));
  } else if (opcode == spv::Op::OpExecutionMode ||
             opcode == spv::Op::OpExecutionModeId) {
    const uint32_t entry_point = inst->word(1);
    _.RegisterExecutionModeForEntryPoint(entry_point,
                                         spv::ExecutionMode(inst->word(2)));
  } else if (opcode == spv::Op::OpVariable) {
    const auto storage_class = inst->GetOperandAs<spv::StorageClass>(2);
    if (auto error = LimitCheckNumVars(_, inst->id(), storage_class)) {
      return error;
    }
  } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
    if (!_.HasCapability(spv::Capability::BindlessTextureNV)) {
      return _.diag(SPV_ERROR_MISSING_EXTENSION, inst)
             << "OpSamplerImageAddressingModeNV supported only with extension "
                "SPV_NV_bindless_texture";
    }
    uint32_t bitwidth = inst->GetOperandAs<uint32_t>(0);
    if (_.samplerimage_variable_address_mode() != 0) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpSamplerImageAddressingModeNV should only be provided once";
    }
    if (bitwidth != 32 && bitwidth != 64) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
    }
    _.set_samplerimage_variable_address_mode(bitwidth);
  }

  if (auto error = ReservedCheck(_, inst)) return error;
  if (auto error = CapabilityCheck(_, inst)) return error;
  if (auto error = LimitCheckIdBound(_, inst)) return error;
  if (auto error = LimitCheckStruct(_, inst)) return error;
  if (auto error = LimitCheckSwitch(_, inst)) return error;
  if (auto error = VersionCheck(_, inst)) return error;

  // All instruction checks have passed.
  return SPV_SUCCESS;
}